

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O0

int nghttp2_http_parse_priority(nghttp2_extpri *dest,uint8_t *value,size_t valuelen)

{
  uint8_t *puVar1;
  uint8_t *end_00;
  ssize_t sVar2;
  bool bVar3;
  size_t keylen;
  uint8_t *key;
  nghttp2_extpri pri;
  nghttp2_sf_value val;
  ssize_t slen;
  uint8_t *end;
  uint8_t *p;
  size_t valuelen_local;
  uint8_t *value_local;
  nghttp2_extpri *dest_local;
  
  end_00 = value + valuelen;
  key = *(uint8_t **)dest;
  end = value;
  while( true ) {
    bVar3 = false;
    if (end != end_00) {
      bVar3 = *end == ' ';
    }
    if (!bVar3) break;
    end = end + 1;
  }
  while (puVar1 = end, end != end_00) {
    sVar2 = sf_parse_key(end,end_00);
    if (sVar2 < 0) {
      return -0x1f5;
    }
    end = end + sVar2;
    if ((end == end_00) || (*end != '=')) {
      pri.urgency._0_1_ = '\0';
      val.type = '\x01';
      val._1_3_ = 0;
      val.field_1.s.len = sf_parse_params(end,end_00);
      if ((long)val.field_1.s.len < 0) {
        return -0x1f5;
      }
    }
    else {
      end = end + 1;
      if (end == end_00) {
        return -0x1f5;
      }
      val.field_1.s.len = sf_parse_item_or_inner_list((nghttp2_sf_value *)&pri,end,end_00);
      if ((long)val.field_1.s.len < 0) {
        return -0x1f5;
      }
    }
    end = end + val.field_1.s.len;
    if (sVar2 == 1) {
      if (*puVar1 == 'i') {
        if ((char)pri.urgency != '\0') {
          return -0x1f5;
        }
        key = (uint8_t *)CONCAT44(val._0_4_,key._0_4_);
      }
      else if (*puVar1 == 'u') {
        if ((((char)pri.urgency != '\x01') || ((int)val._4_4_ < 0)) ||
           (7 < CONCAT44(val._4_4_,val._0_4_))) {
          return -0x1f5;
        }
        key = (uint8_t *)CONCAT44(key._4_4_,val._0_4_);
      }
    }
    while( true ) {
      if (end == end_00) goto LAB_00c531b8;
      if ((*end != ' ') && (*end != '\t')) break;
      end = end + 1;
    }
    if (*end != ',') {
      return -0x1f5;
    }
    do {
      end = end + 1;
      if (end == end_00) {
        return -0x1f5;
      }
    } while ((*end == ' ') || (*end == '\t'));
  }
LAB_00c531b8:
  *dest = (nghttp2_extpri)key;
  return 0;
}

Assistant:

int nghttp2_http_parse_priority(nghttp2_extpri *dest, const uint8_t *value,
                                size_t valuelen) {
  const uint8_t *p = value, *end = value + valuelen;
  ssize_t slen;
  nghttp2_sf_value val;
  nghttp2_extpri pri = *dest;
  const uint8_t *key;
  size_t keylen;

  for (; p != end && *p == ' '; ++p)
    ;

  for (; p != end;) {
    slen = sf_parse_key(p, end);
    if (slen < 0) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    key = p;
    keylen = (size_t)slen;

    p += slen;

    if (p == end || *p != '=') {
      /* Boolean true */
      val.type = NGHTTP2_SF_VALUE_TYPE_BOOLEAN;
      val.b = 1;

      slen = sf_parse_params(p, end);
      if (slen < 0) {
        return NGHTTP2_ERR_INVALID_ARGUMENT;
      }
    } else if (++p == end) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    } else {
      slen = sf_parse_item_or_inner_list(&val, p, end);
      if (slen < 0) {
        return NGHTTP2_ERR_INVALID_ARGUMENT;
      }
    }

    p += slen;

    if (keylen == 1) {
      switch (key[0]) {
      case 'i':
        if (val.type != NGHTTP2_SF_VALUE_TYPE_BOOLEAN) {
          return NGHTTP2_ERR_INVALID_ARGUMENT;
        }

        pri.inc = val.b;

        break;
      case 'u':
        if (val.type != NGHTTP2_SF_VALUE_TYPE_INTEGER ||
            val.i < NGHTTP2_EXTPRI_URGENCY_HIGH ||
            NGHTTP2_EXTPRI_URGENCY_LOW < val.i) {
          return NGHTTP2_ERR_INVALID_ARGUMENT;
        }

        pri.urgency = (uint32_t)val.i;

        break;
      }
    }

    sf_discard_ows(p, end);

    if (*p++ != ',') {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    sf_discard_ows_end_err(p, end, NGHTTP2_ERR_INVALID_ARGUMENT);
  }

fin:
  *dest = pri;

  return 0;
}